

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::EndpointDeclaration::EndpointDeclaration
          (EndpointDeclaration *this,Allocator *a,Context *c,bool isInputEndpoint,EndpointType type)

{
  EndpointDetails *pEVar1;
  EndpointType type_local;
  
  ASTObject::ASTObject(&this->super_ASTObject,EndpointDeclaration,c);
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__EndpointDeclaration_0032eea0;
  this->isInput = isInputEndpoint;
  (this->name).name = (string *)0x0;
  pEVar1 = PoolAllocator::allocate<soul::AST::EndpointDetails,soul::EndpointType&>
                     (&a->pool,&type_local);
  (this->details).object = pEVar1;
  (this->childPath).object = (ChildEndpointPath *)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->annotation).properties.
  super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->needsToBeExposedInParent = false;
  this->isConsoleEndpoint = false;
  (this->generatedInput).object = (InputDeclaration *)0x0;
  (this->generatedOutput).object = (OutputDeclaration *)0x0;
  return;
}

Assistant:

EndpointDeclaration (Allocator& a, const Context& c, bool isInputEndpoint, EndpointType type)
            : ASTObject (ObjectType::EndpointDeclaration, c), isInput (isInputEndpoint),
                         details (a.allocate<EndpointDetails> (type)) {}